

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper.cpp
# Opt level: O2

int __thiscall
Mapper::calculateSizeRequirement
          (Mapper *this,string *label,uint instructionIndex,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *labelMap,vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *instructions)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  mapped_type *pmVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  out_of_range anon_var_0;
  
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)labelMap,label);
  uVar1 = *pmVar4;
  iVar3 = 0;
  if (uVar1 != instructionIndex) {
    if (instructionIndex < uVar1) {
      lVar5 = 10;
      for (uVar8 = instructionIndex + 1; uVar8 < uVar1; uVar8 = uVar8 + 1) {
        uVar6 = (ulong)(instructions->
                       super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar8].length;
        lVar2 = lVar5 + 10;
        if (uVar6 != 0) {
          lVar2 = lVar5;
        }
        lVar5 = lVar2 + uVar6;
      }
    }
    else {
      uVar7 = (ulong)(instructionIndex - 1);
      uVar6 = uVar7 << 6 | 0x30;
      lVar5 = 0;
      do {
        uVar8 = (uint)uVar7;
        if (uVar8 < (uint)uVar1) break;
        uVar7 = (ulong)*(uint *)(((instructions->
                                  super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->bytecode +
                                (uVar6 - 0x20));
        lVar2 = lVar5 + 10;
        if (uVar7 != 0) {
          lVar2 = lVar5;
        }
        lVar5 = lVar2 + uVar7;
        uVar6 = uVar6 - 0x40;
        uVar7 = (ulong)(uVar8 - 1);
      } while (uVar8 != 0);
      lVar5 = -lVar5;
    }
    if ((char)lVar5 == lVar5) {
      iVar3 = (uint)(0 < lVar5) * 2 + 1;
    }
    else if ((short)lVar5 == lVar5) {
      iVar3 = (uint)(0 < lVar5) * 2 + 2;
    }
    else if ((int)lVar5 == lVar5) {
      iVar3 = (uint)(0 < lVar5) * 2 + 4;
    }
    else {
      iVar3 = (uint)(0 < lVar5) * 2 + 8;
    }
  }
  return iVar3;
}

Assistant:

int Mapper::calculateSizeRequirement(std::string label, unsigned int instructionIndex, std::unordered_map<std::string, size_t> labelMap,
	std::vector<AssemberInstruction> instructions) {

	size_t labelIndex;
	try {
		labelIndex = labelMap.at(label);
	}
	catch (std::out_of_range) {
		return 0;
	}
	if (labelIndex == instructionIndex) {
		return 0;
	}
	int64_t delta;
	if (labelIndex > instructionIndex) {
		delta = sizeof(uint64_t) + 2; // assume max length for the jump instruction (10 bytes)
		for (unsigned int i = instructionIndex + 1; i < labelIndex; i++) {
			size_t instructionLength = instructions[i].length;
			int unAssembled = 0;
			if (instructionLength == 0) {
				// Instruction hasn't been assembled yet because it contains label that hasn't been resolved, thus it's length is unknown
				unAssembled++;
			}
			else {
				delta += instructionLength;
			}
			if (unAssembled) {
				// assume the unassembled instructions will take max space
				delta += (unAssembled * (2 + sizeof(uint64_t)));
			}
		}
	}
	else {
		delta = 0;
		for (unsigned int i = instructionIndex - 1; i >= labelIndex; i--) {
			size_t instructionLength = instructions[i].length;
			int unAssembled = 0;
			if (instructionLength == 0) {
				// Instruction hasn't been assembled yet because it contains label that hasn't been resolved, thus it's length is unknown
				unAssembled++;
			}
			else {
				delta += instructionLength;
			}
			if (unAssembled) {
				// assume the unassembled instructions will take max space
				delta += (unAssembled * (2 + sizeof(uint64_t)));
			}
			if (i == 0)
				break;
		}
		delta = -delta;
	}
	if (SCHAR_MIN <= delta && delta <= SCHAR_MAX) {
		return (delta > 0) ? (sizeof(int8_t) + 2) : sizeof(int8_t);
	}
	else if (SHRT_MIN <= delta && delta <= SHRT_MAX) {
		return (delta > 0) ? (sizeof(int16_t) + 2) : sizeof(int16_t);
	}
	else if (INT32_MIN <= delta && delta <= INT32_MAX) {
		return (delta > 0) ? (sizeof(int32_t) + 2) : sizeof(int32_t);
	}
	return (delta > 0) ? (2 + sizeof(int64_t)) : sizeof(int64_t);
}